

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<_5a9a11fd_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
::
emplace_new_key<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>
          (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>
          *key)

{
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false> *p_Var1;
  Scope *pSVar2;
  Definition *pDVar3;
  _Head_base<0UL,_slang::ast::Definition_*,_false> _Var4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
  sVar8;
  long lVar9;
  EntryPointer psVar10;
  undefined8 unaff_RBP;
  undefined7 uVar12;
  ulong uVar11;
  _Head_base<0UL,_slang::ast::Definition_*,_false> _Var13;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var14;
  EntryPointer psVar15;
  char cVar16;
  pointer *__ptr;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pair<_5a9a11fd_> pVar19;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  undefined1 local_58 [24];
  _Head_base<0UL,_slang::ast::Definition_*,_false> local_40;
  size_t local_38;
  char *pcStack_30;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
       )distance_from_desired)) {
    lVar9 = *(long *)(this + 0x18) + 1;
    auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar17._0_8_ = lVar9;
    auVar17._12_4_ = 0x45300000;
    lVar7 = *(long *)(this + 8) + 1;
    auVar18._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar18._0_8_ = lVar7;
    auVar18._12_4_ = 0x45300000;
    if ((auVar17._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar18._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) {
      p_Var1 = &(key->first).
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
      ;
      uVar12 = (undefined7)((ulong)unaff_RBP >> 8);
      if (current_entry->distance_from_desired < '\0') {
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
             (key->first).
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
             super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
        pcVar6 = (key->first).
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .
                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_str;
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = (p_Var1->_M_head_impl)._M_len;
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = pcVar6;
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
        .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl =
             (key->second)._M_t.
             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
             .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
        (key->second)._M_t.
        super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
        .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl = (Definition *)0x0;
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar11 = CONCAT71(uVar12,1);
      }
      else {
        pSVar2 = (key->first).
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                 super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
        local_38 = (p_Var1->_M_head_impl)._M_len;
        pcStack_30 = (key->first).
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .
                     super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_str;
        pDVar3 = (key->second)._M_t.
                 super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                 .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
        (key->second)._M_t.
        super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
        .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl = (Definition *)0x0;
        cVar16 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        local_58._8_8_ =
             (current_entry->field_1).value.first.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len;
        local_58._16_8_ =
             (current_entry->field_1).value.first.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_str;
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = local_38;
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = pcStack_30;
        _Var14._M_head_impl =
             (current_entry->field_1).value.first.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
             super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
        (current_entry->field_1).value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl = pSVar2;
        _Var13._M_head_impl =
             (current_entry->field_1).value.second._M_t.
             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
             .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
        .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl = pDVar3;
        sVar8 = (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
                 )(cVar16 + '\x01');
        psVar10 = current_entry + 1;
        cVar16 = current_entry[1].distance_from_desired;
        psVar15 = current_entry;
        if (-1 < cVar16) {
          p_Var1 = &(current_entry->field_1).value.first.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .
                    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
          ;
          do {
            psVar15 = psVar10;
            if (cVar16 < (char)sVar8) {
              psVar15->distance_from_desired = (int8_t)sVar8;
              local_38 = local_58._8_8_;
              pcStack_30 = (char *)local_58._16_8_;
              sVar5 = (psVar15->field_1).value.first.
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      .
                      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                      ._M_head_impl._M_len;
              pcVar6 = (psVar15->field_1).value.first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_str;
              (psVar15->field_1).value.first.
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
              _M_head_impl._M_len = local_58._8_8_;
              (psVar15->field_1).value.first.
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
              _M_head_impl._M_str = (char *)local_58._16_8_;
              pSVar2 = (psVar15->field_1).value.first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                       super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
              _Var4._M_head_impl =
                   (psVar15->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                   .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
              (psVar15->field_1).value.first.
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
              super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                   _Var14._M_head_impl;
              (psVar15->field_1).value.second._M_t.
              super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
              .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl =
                   _Var13._M_head_impl;
              sVar8 = (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
                       )(cVar16 + '\x01');
              _Var13._M_head_impl = _Var4._M_head_impl;
              _Var14._M_head_impl = pSVar2;
              local_58._8_8_ = sVar5;
              local_58._16_8_ = pcVar6;
            }
            else {
              sVar8 = (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
                       )((char)sVar8 + '\x01');
              if (sVar8 == this[0x11]) {
                local_38 = local_58._8_8_;
                pcStack_30 = (char *)local_58._16_8_;
                sVar5 = (p_Var1->_M_head_impl)._M_len;
                pcVar6 = (current_entry->field_1).value.first.
                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         .
                         super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                         ._M_head_impl._M_str;
                (p_Var1->_M_head_impl)._M_len = local_58._8_8_;
                (current_entry->field_1).value.first.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_str = (char *)local_58._16_8_;
                local_58._0_8_ =
                     (current_entry->field_1).value.first.
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                     super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
                (current_entry->field_1).value.first.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                     _Var14._M_head_impl;
                local_40._M_head_impl =
                     (current_entry->field_1).value.second._M_t.
                     super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                     .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl;
                (current_entry->field_1).value.second._M_t.
                super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
                .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl =
                     _Var13._M_head_impl;
                local_58._8_8_ = sVar5;
                local_58._16_8_ = pcVar6;
                sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                ::grow((sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                        *)this);
                pVar19 = emplace<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>
                                   (this,(pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>
                                          *)local_58);
                current_entry = (EntryPointer)pVar19.first.current;
                uVar11 = (ulong)pVar19._8_4_;
                goto LAB_00232b0c;
              }
            }
            cVar16 = psVar15[1].distance_from_desired;
            psVar10 = psVar15 + 1;
          } while (-1 < cVar16);
        }
        psVar15[1].field_1.value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl = _Var14._M_head_impl;
        psVar15[1].field_1.value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = local_58._8_8_;
        psVar15[1].field_1.value.first.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = (char *)local_58._16_8_;
        psVar15[1].field_1.value.second._M_t.
        super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::ast::Definition_*,_std::default_delete<slang::ast::Definition>_>
        .super__Head_base<0UL,_slang::ast::Definition_*,_false>._M_head_impl = _Var13._M_head_impl;
        local_40._M_head_impl = (Definition *)0x0;
        psVar10->distance_from_desired = (int8_t)sVar8;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar11 = CONCAT71(uVar12,1);
        local_58._0_8_ = _Var14._M_head_impl;
LAB_00232b0c:
        if ((_Head_base<0UL,_slang::ast::Definition_*,_false>)local_40._M_head_impl !=
            (_Head_base<0UL,_slang::ast::Definition_*,_false>)0x0) {
          std::default_delete<slang::ast::Definition>::operator()
                    ((default_delete<slang::ast::Definition> *)&local_40,local_40._M_head_impl);
        }
      }
      goto LAB_00232948;
    }
  }
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
          *)this);
  pVar19 = emplace<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>
                     (this,key);
  current_entry = (EntryPointer)pVar19.first.current;
  uVar11 = (ulong)pVar19._8_4_;
LAB_00232948:
  pVar19._8_8_ = uVar11 & 0xffffffff;
  pVar19.first.current = current_entry;
  return pVar19;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }